

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switches.cpp
# Opt level: O0

pair<switches,_int> *
get_switches(pair<switches,_int> *__return_storage_ptr__,int argc,tchar **argv)

{
  revision_opt *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  int local_a4;
  undefined1 local_a0 [8];
  switches result;
  allocator local_41;
  string local_40 [32];
  tchar **local_20;
  tchar **argv_local;
  pair<switches,_int> *ppStack_10;
  int argc_local;
  
  local_20 = argv;
  argv_local._4_4_ = argc;
  ppStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"pstore read utility\n",&local_41);
  pstore::command_line::parse_command_line_options(argc,argv,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  switches::switches((switches *)local_a0);
  this = pstore::command_line::
         opt<pstore::command_line::revision_opt,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
         ::get((opt<pstore::command_line::revision_opt,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                *)(anonymous_namespace)::revision_abi_cxx11_);
  result._56_4_ = pstore::command_line::revision_opt::operator_cast_to_unsigned_int(this);
  pbVar1 = pstore::command_line::
           opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
           ::get((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                  *)(anonymous_namespace)::db_path_abi_cxx11_);
  std::__cxx11::string::operator=((string *)local_a0,(string *)pbVar1);
  pbVar1 = pstore::command_line::
           opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
           ::get((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                  *)(anonymous_namespace)::key_abi_cxx11_);
  std::__cxx11::string::operator=((string *)&result.field_0x18,(string *)pbVar1);
  result._60_1_ =
       pstore::command_line::opt<bool,_pstore::command_line::parser<bool,_void>_>::get
                 ((opt<bool,_pstore::command_line::parser<bool,_void>_> *)
                  (anonymous_namespace)::string_mode);
  local_a4 = 0;
  std::pair<switches,_int>::pair<switches_&,_int,_true>
            (__return_storage_ptr__,(switches *)local_a0,&local_a4);
  switches::~switches((switches *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::pair<switches, int> get_switches (int argc, tchar * argv[]) {
    parse_command_line_options (argc, argv, "pstore read utility\n");

    switches result;
    result.revision = static_cast<unsigned> (revision.get ());
    result.db_path = db_path.get ();
    result.key = key.get ();
    result.string_mode = string_mode.get ();

    return {result, EXIT_SUCCESS};
}